

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask14_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0xe | *out;
  *out = in[2] << 0x1c | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] >> 4;
  *puVar1 = in[3] << 10 | *puVar1;
  *puVar1 = in[4] << 0x18 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4] >> 8;
  *puVar1 = in[5] << 6 | *puVar1;
  *puVar1 = in[6] << 0x14 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[6] >> 0xc;
  *puVar1 = in[7] << 2 | *puVar1;
  *puVar1 = in[8] << 0x10 | *puVar1;
  *puVar1 = in[9] << 0x1e | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[9] >> 2;
  *puVar1 = in[10] << 0xc | *puVar1;
  *puVar1 = in[0xb] << 0x1a | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[0xb] >> 6;
  *puVar1 = in[0xc] << 8 | *puVar1;
  *puVar1 = in[0xd] << 0x16 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[0xd] >> 10;
  *puVar1 = in[0xe] << 4 | *puVar1;
  *puVar1 = in[0xf] << 0x12 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0x10];
  *puVar1 = in[0x11] << 0xe | *puVar1;
  *puVar1 = in[0x12] << 0x1c | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0x12] >> 4;
  *puVar1 = in[0x13] << 10 | *puVar1;
  *puVar1 = in[0x14] << 0x18 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0x14] >> 8;
  *puVar1 = in[0x15] << 6 | *puVar1;
  *puVar1 = in[0x16] << 0x14 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0x16] >> 0xc;
  *puVar1 = in[0x17] << 2 | *puVar1;
  return out + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask14_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (14 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (14 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (14 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;

  return out + 1;
}